

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void Mf_ManPrintInit(Mf_Man_t *p)

{
  Mf_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    printf("LutSize = %d  ",(ulong)(uint)p->pPars->nLutSize);
    printf("CutNum = %d  ",(ulong)(uint)p->pPars->nCutNum);
    printf("Iter = %d  ",(ulong)(uint)(p->pPars->nRounds + p->pPars->nRoundsEla));
    printf("Edge = %d  ",(ulong)(uint)p->pPars->fOptEdge);
    printf("CutMin = %d  ",(ulong)(uint)p->pPars->fCutMin);
    printf("Coarse = %d  ",(ulong)(uint)p->pPars->fCoarsen);
    printf("CNF = %d  ",(ulong)(uint)p->pPars->fGenCnf);
    printf("\n");
    printf("Computing cuts...\r");
    fflush(_stdout);
  }
  return;
}

Assistant:

void Mf_ManPrintInit( Mf_Man_t * p )
{
    if ( !p->pPars->fVerbose )
        return;
    printf( "LutSize = %d  ", p->pPars->nLutSize );
    printf( "CutNum = %d  ",  p->pPars->nCutNum );
    printf( "Iter = %d  ",    p->pPars->nRounds + p->pPars->nRoundsEla );
    printf( "Edge = %d  ",    p->pPars->fOptEdge );
    printf( "CutMin = %d  ",  p->pPars->fCutMin );
    printf( "Coarse = %d  ",  p->pPars->fCoarsen );
    printf( "CNF = %d  ",     p->pPars->fGenCnf );
    printf( "\n" );
    printf( "Computing cuts...\r" );
    fflush( stdout );
}